

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O0

VulkanMock * get_and_setup_default(void)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar1;
  VkExtensionProperties local_524;
  VkExtensionProperties local_420;
  VkExtensionProperties local_31c;
  VkExtensionProperties local_218;
  VkExtensionProperties local_114;
  VulkanMock *local_10;
  VulkanMock *mock;
  
  local_10 = (VulkanMock *)get_vulkan_mock();
  pvVar1 = &local_10->instance_extensions;
  get_extension_properties(&local_114,"VK_KHR_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            (pvVar1,&local_114);
  pvVar1 = &local_10->instance_extensions;
  get_extension_properties(&local_218,"VK_KHR_xcb_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            (pvVar1,&local_218);
  pvVar1 = &local_10->instance_extensions;
  get_extension_properties(&local_31c,"VK_KHR_xlib_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            (pvVar1,&local_31c);
  pvVar1 = &local_10->instance_extensions;
  get_extension_properties(&local_420,"VK_KHR_wayland_surface");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            (pvVar1,&local_420);
  pvVar1 = &local_10->instance_extensions;
  get_extension_properties(&local_524,"VK_EXT_debug_utils");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            (pvVar1,&local_524);
  add_basic_physical_device(local_10);
  return local_10;
}

Assistant:

VulkanMock& get_and_setup_default() {
    VulkanMock& mock = *get_vulkan_mock();
    mock.instance_extensions.push_back(get_extension_properties(VK_KHR_SURFACE_EXTENSION_NAME));
#if defined(_WIN32)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_win32_surface"));
#elif defined(__ANDROID__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_android_surface"));
#elif defined(_DIRECT2DISPLAY)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_display"));
#elif defined(__linux__) || defined(__FreeBSD__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xcb_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xlib_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_wayland_surface"));
#elif defined(__APPLE__)
    mock.instance_extensions.push_back(get_extension_properties("VK_EXT_metal_surface"));
#endif
    mock.instance_extensions.push_back(get_extension_properties(VK_EXT_DEBUG_UTILS_EXTENSION_NAME));
    add_basic_physical_device(mock);
    return mock;
}